

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_sd_right_to_left<double,double>(double *x,size_t n,double *sd_arr)

{
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  dVar6 = 0.0;
  dVar5 = 0.0;
  lVar3 = n - 1;
  lVar4 = 0;
  dVar7 = x[n - 1];
  while (lVar3 != 0) {
    dVar2 = x[lVar3];
    lVar1 = lVar4 + 1;
    auVar10._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar10._0_8_ = lVar1;
    auVar10._12_4_ = 0x45300000;
    dVar8 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
    dVar6 = dVar6 + (dVar2 - dVar6) / dVar8;
    dVar5 = dVar5 + (dVar2 - dVar7) * (dVar2 - dVar6);
    dVar7 = 0.0;
    if (lVar4 != 0) {
      dVar7 = SQRT(dVar5 / dVar8);
    }
    sd_arr[lVar3] = dVar7;
    lVar3 = lVar3 + -1;
    lVar4 = lVar1;
    dVar7 = dVar6;
  }
  dVar2 = *x;
  auVar9._8_4_ = (int)(n >> 0x20);
  auVar9._0_8_ = n;
  auVar9._12_4_ = 0x45300000;
  dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0);
  return SQRT(((dVar2 - dVar7) * (dVar2 - ((dVar2 - dVar6) / dVar8 + dVar6)) + dVar5) / dVar8);
}

Assistant:

real_t calc_sd_right_to_left(real_t_ *restrict x, size_t n, double *restrict sd_arr)
{
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[n-1];
    for (size_t row = 0; row < n-1; row++)
    {
        running_mean   += (x[n-row-1] - running_mean) / (real_t)(row+1);
        running_ssq    += (x[n-row-1] - running_mean) * (x[n-row-1] - mean_prev);
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / (real_t)(row+1));
    }
    running_mean   += (x[0] - running_mean) / (real_t)n;
    running_ssq    += (x[0] - running_mean) * (x[0] - mean_prev);
    return std::sqrt(running_ssq / (real_t)n);
}